

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_num
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  num_writer f;
  char cVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  reference pcVar8;
  char *pcVar9;
  back_insert_iterator<fmt::v6::detail::buffer<char>_> bVar10;
  string_view prefix;
  undefined4 uStack_ac;
  undefined7 uStack_9f;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  const_iterator group;
  int size;
  int num_digits;
  char sep;
  detail local_30 [8];
  string groups;
  int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
  *this_local;
  
  grouping<char>(local_30,(locale_ref)(this->locale).locale_);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cVar2 = thousands_sep<char>((locale_ref)(this->locale).locale_);
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      group._M_current._0_4_ = count_digits(this->abs_value);
      group._M_current._4_4_ = (int)group._M_current;
      local_68._M_current = (char *)std::__cxx11::string::cbegin();
      while( true ) {
        local_70._M_current = (char *)std::__cxx11::string::cend();
        bVar3 = __gnu_cxx::operator!=(&local_68,&local_70);
        iVar6 = group._M_current._4_4_;
        bVar5 = false;
        if (bVar3) {
          pcVar8 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_68);
          bVar5 = false;
          if (*pcVar8 < iVar6) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_68);
            bVar5 = false;
            if ('\0' < *pcVar8) {
              pcVar8 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_68);
              cVar1 = *pcVar8;
              cVar4 = max_value<char>();
              bVar5 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar5) break;
        group._M_current._0_4_ = (int)group._M_current + 1;
        pcVar8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_68);
        group._M_current._4_4_ = group._M_current._4_4_ - *pcVar8;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_68);
      }
      local_78._M_current = (char *)std::__cxx11::string::cend();
      bVar5 = __gnu_cxx::operator==(&local_68,&local_78);
      if (bVar5) {
        iVar6 = group._M_current._4_4_ + -1;
        pcVar9 = (char *)std::__cxx11::string::back();
        group._M_current._0_4_ = iVar6 / (int)*pcVar9 + (int)group._M_current;
      }
      iVar6 = (int)group._M_current;
      bVar10.container = (this->out).container;
      prefix = get_prefix(this);
      f._12_4_ = uStack_ac;
      f.size = (int)group._M_current;
      f._25_7_ = uStack_9f;
      f.sep = cVar2;
      f.abs_value = this->abs_value;
      f.groups = (string *)local_30;
      bVar10 = write_int<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,fmt::v6::detail::int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned_long>::num_writer>
                         (bVar10,iVar6,prefix,this->specs,f);
      (this->out).container = bVar10.container;
    }
  }
  else {
    on_dec(this);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && num_digits > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      num_digits -= *group;
      ++group;
    }
    if (group == groups.cend())
      size += sep_size * ((num_digits - 1) / groups.back());
    out = write_int(out, size, get_prefix(), specs,
                    num_writer{abs_value, size, groups, sep});
  }